

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
          *f)

{
  undefined8 *__n;
  char *__value;
  char_type fill;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __value = (char *)((ulong)spec->width_ - f->size_);
  if ((ulong)spec->width_ < f->size_ || __value == (char *)0x0) {
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    return;
  }
  if (spec->align_ == ALIGN_CENTER) {
    local_58 = *(undefined8 *)this;
    uStack_50 = *(undefined8 *)(this + 8);
    std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
              (&local_88,(unsigned_long)&local_58,(char *)((ulong)__value >> 1));
    *(ostream_type **)this = local_88._M_stream;
    *(char **)(this + 8) = local_88._M_string;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    local_68 = *(undefined8 *)this;
    uStack_60 = *(undefined8 *)(this + 8);
    __n = &local_68;
    __value = __value + -(long)((ulong)__value >> 1);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      local_48 = *(undefined8 *)this;
      uStack_40 = *(undefined8 *)(this + 8);
      std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
                (&local_88,(unsigned_long)&local_48,__value);
      *(ostream_type **)this = local_88._M_stream;
      *(char **)(this + 8) = local_88._M_string;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                    *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                  *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    local_78 = *(undefined8 *)this;
    uStack_70 = *(undefined8 *)(this + 8);
    __n = &local_78;
  }
  std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
            (&local_88,(unsigned_long)__n,__value);
  *(ostream_type **)this = local_88._M_stream;
  *(char **)(this + 8) = local_88._M_string;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }